

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipEntry.hpp
# Opt level: O2

string * __thiscall
Zippy::Impl::ZipEntry::GetDataAsString_abi_cxx11_(string *__return_storage_ptr__,ZipEntry *this)

{
  pointer puVar1;
  uchar *ch;
  pointer puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (this->m_EntryData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_EntryData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,*puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetDataAsString() const {

                std::string result;
                for (const auto & ch : m_EntryData)
                    result += static_cast<char>(ch); // TODO: Should this use reinterpret_cast instead?

                return result;
            }